

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O0

void ImStb::stb_textedit_clear_state(STB_TexteditState *state,int is_single_line)

{
  int is_single_line_local;
  STB_TexteditState *state_local;
  
  (state->undostate).undo_point = 0;
  (state->undostate).undo_char_point = 0;
  (state->undostate).redo_point = 99;
  (state->undostate).redo_char_point = 999;
  state->select_start = 0;
  state->select_end = 0;
  state->cursor = 0;
  state->has_preferred_x = '\0';
  state->preferred_x = 0.0;
  state->cursor_at_end_of_line = '\0';
  state->initialized = '\x01';
  state->single_line = (uchar)is_single_line;
  state->insert_mode = '\0';
  return;
}

Assistant:

static void stb_textedit_clear_state(STB_TexteditState *state, int is_single_line)
{
   state->undostate.undo_point = 0;
   state->undostate.undo_char_point = 0;
   state->undostate.redo_point = STB_TEXTEDIT_UNDOSTATECOUNT;
   state->undostate.redo_char_point = STB_TEXTEDIT_UNDOCHARCOUNT;
   state->select_end = state->select_start = 0;
   state->cursor = 0;
   state->has_preferred_x = 0;
   state->preferred_x = 0;
   state->cursor_at_end_of_line = 0;
   state->initialized = 1;
   state->single_line = (unsigned char) is_single_line;
   state->insert_mode = 0;
}